

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O1

int armci_check_contiguous(int *src_stride,int *dst_stride,int *count,int n_stride)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  int local_58 [4];
  int dst_ld [7];
  int src_ld [7];
  
  dst_ld[4] = *src_stride;
  local_58[0] = *dst_stride;
  uVar5 = (ulong)(uint)n_stride;
  if (1 < n_stride) {
    uVar6 = 1;
    do {
      dst_ld[uVar6 + 4] = src_stride[uVar6] / src_stride[uVar6 - 1];
      local_58[uVar6] = dst_stride[uVar6] / dst_stride[uVar6 - 1];
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  bVar2 = false;
  if (n_stride < 1) {
    uVar3 = 1;
  }
  else {
    uVar3 = 1;
    lVar4 = 0;
    do {
      iVar1 = count[lVar4];
      if (iVar1 < dst_ld[lVar4 + 4]) {
        if (bVar2) goto LAB_0017c7a6;
LAB_0017c768:
        if (iVar1 < dst_ld[lVar4 + 4]) {
          if (!bVar2) goto LAB_0017c7bd;
LAB_0017c771:
          if (iVar1 != 1 && bVar2) {
            bVar2 = true;
            goto LAB_0017c7a6;
          }
        }
        else {
          if (local_58[lVar4] <= iVar1 || bVar2) goto LAB_0017c771;
LAB_0017c7bd:
          bVar2 = true;
        }
        bVar7 = false;
      }
      else {
        if (local_58[lVar4] <= iVar1 || !bVar2) goto LAB_0017c768;
LAB_0017c7a6:
        bVar7 = true;
        uVar3 = 0;
      }
    } while ((!bVar7) && (bVar7 = uVar5 - 1 != lVar4, lVar4 = lVar4 + 1, bVar7));
  }
  if ((0 < n_stride) && ((bVar2 && (uVar3 == 1)))) {
    uVar3 = (uint)(count[uVar5] == 1);
  }
  return uVar3;
}

Assistant:

int armci_check_contiguous(int *src_stride, int *dst_stride,
    int *count, int n_stride)
{
#if 1
  /* This is code from the merge between CMX and the current develop branch
   * (2018/7/5) */
  int i;
  int ret = 1;
  int stridelen = 1;
  int gap = 0;
  int src_ld[7], dst_ld[7];
  /**
   * Calculate physical dimensions of buffers from stride arrays
   */
  src_ld[0] = src_stride[0];
  dst_ld[0] = dst_stride[0];
  for (i=1; i<n_stride; i++) {
    src_ld[i] = src_stride[i]/src_stride[i-1];
    dst_ld[i] = dst_stride[i]/dst_stride[i-1];
  }
  /* NOTE: The count array contains the length of the final dimension and can
   * be used to evaluate some corner cases
   */
  for (i=0; i<n_stride; i++) {
    /* check for overflow */
    int tmp = stridelen * count[i];
    if (stridelen != 0 && tmp / stridelen != count[i]) {
      ret = 0;
      break;
    }
    stridelen = tmp;
    if ((count[i] < src_ld[i] || count[i] < dst_ld[i])
        && gap == 1) {
      /* Data is definitely strided in memory */
      ret = 0;
      break;
    } else if ((count[i] < src_ld[i] || count[i] < dst_ld[i]) &&
        gap == 0) {
      /* First dimension that doesn't match physical dimension */
      gap = 1;
    } else if (count[i] != 1 && gap == 1) {
      /* Found a mismatch between requested block and physical dimensions
       * indicating a possible stride in memory
       * */
      ret = 0;
      break;
    }
  }
  /**
   * Everything looks good up to this point but need to verify that last
   * dimension is 1 if a mismatch between requested block and physical
   * array dimensions has been found previously
   */
  if (gap == 1 && ret == 1 && n_stride > 0) {
    if (count[n_stride] != 1) ret = 0;
  }
  return ret;
#else
  int i;
  int ret = 1;
  int stridelen = 1;
  /* NOTE: The count array contains the length of the final dimension and could
   * be used to evaluate some corner cases that are not picked up by this
   * algorithm
   */ 
  for (i=0; i<n_stride; i++) {
    /* check for overflow */
    int tmp = stridelen * count[i];
    if (stridelen != 0 && tmp / stridelen != count[i]) {
      ret = 0;
      break;
    }
    stridelen = tmp;
    if (stridelen < src_stride[i] || stridelen < dst_stride[i]) {
      ret = 0;
      break;
    }
  }
  return ret;
#endif
}